

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<long> __thiscall Omega_h::subtract_from_each<long>(Omega_h *this,Read<long> *a,long b)

{
  void *extraout_RDX;
  Read<long> RVar1;
  Write<long> local_d8;
  undefined1 local_c8 [8];
  type_conflict1 f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<long> c;
  long b_local;
  Read<long> *a_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  c.shared_alloc_.direct_ptr = (void *)b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<long>::Write((Write<long> *)local_68,(LO)(local_10 >> 3),(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Write<long>::Write((Write<long> *)local_c8,(Write<int> *)local_68);
  Read<long>::Read((Read<long> *)&f.c.shared_alloc_.direct_ptr,(Read<int> *)a);
  f.a.write_.shared_alloc_.direct_ptr = c.shared_alloc_.direct_ptr;
  if (((ulong)local_68 & 1) == 0) {
    local_20 = *(size_t *)local_68;
  }
  else {
    local_20 = (ulong)local_68 >> 3;
  }
  parallel_for<Omega_h::subtract_from_each<long>(Omega_h::Read<long>,long)::_lambda(int)_1_>
            ((LO)(local_20 >> 3),(type_conflict1 *)local_c8,"subtract_from_each");
  Write<long>::Write(&local_d8,(Write<int> *)local_68);
  Read<long>::Read((Read<long> *)this,&local_d8);
  Write<long>::~Write(&local_d8);
  subtract_from_each<long>(Omega_h::Read<long>,long)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_c8);
  Write<long>::~Write((Write<long> *)local_68);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<long>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> subtract_from_each(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] - b; };
  parallel_for(c.size(), f, "subtract_from_each");
  return c;
}